

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

string * libcellml::convertNonSiUnits(string *__return_storage_ptr__,string *unitsName)

{
  bool bVar1;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_12;
  allocator<char> local_11;
  
  bVar1 = std::operator==(unitsName,"liter");
  if (bVar1) {
    __s = "litre";
    __a = &local_11;
  }
  else {
    bVar1 = std::operator==(unitsName,"meter");
    if (!bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)unitsName);
      return __return_storage_ptr__;
    }
    __s = "metre";
    __a = &local_12;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string convertNonSiUnits(const std::string &unitsName)
{
    if (unitsName == "liter") {
        return "litre";
    }

    if (unitsName == "meter") {
        return "metre";
    }

    return unitsName;
}